

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void unsetJoinExpr(Expr *p,int iTable)

{
  ExprList *pEVar1;
  long lVar2;
  int i;
  long lVar3;
  
  for (; p != (Expr *)0x0; p = p->pRight) {
    if (((p->flags & 1) != 0) && ((iTable < 0 || (p->iRightJoinTable == iTable)))) {
      p->flags = p->flags & 0xfffffffe;
    }
    if ((p->op == 0xa1) && (pEVar1 = (p->x).pList, pEVar1 != (ExprList *)0x0)) {
      lVar2 = 8;
      for (lVar3 = 0; lVar3 < pEVar1->nExpr; lVar3 = lVar3 + 1) {
        unsetJoinExpr(*(Expr **)((long)pEVar1->a + lVar2 + -8),iTable);
        pEVar1 = (p->x).pList;
        lVar2 = lVar2 + 0x20;
      }
    }
    unsetJoinExpr(p->pLeft,iTable);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable){
  while( p ){
    if( ExprHasProperty(p, EP_FromJoin)
     && (iTable<0 || p->iRightJoinTable==iTable) ){
      ExprClearProperty(p, EP_FromJoin);
    }
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        unsetJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    unsetJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}